

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ImTextureID pvVar4;
  ImDrawCmd *pIVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  this->_VtxCurrentIdx = 0;
  pIVar5 = (this->CmdBuffer).Data;
  lVar12 = (long)(this->CmdBuffer).Size;
  if (pIVar5[lVar12 + -1].ElemCount == 0) {
    pIVar5[lVar12 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
    return;
  }
  fVar6 = (this->_CmdHeader).ClipRect.x;
  fVar7 = (this->_CmdHeader).ClipRect.y;
  fVar8 = (this->_CmdHeader).ClipRect.z;
  fVar9 = (this->_CmdHeader).ClipRect.w;
  pvVar4 = (this->_CmdHeader).TextureId;
  uVar1 = (this->_CmdHeader).VtxOffset;
  uVar2 = (this->IdxBuffer).Size;
  iVar13 = (this->CmdBuffer).Size;
  iVar3 = (this->CmdBuffer).Capacity;
  if (iVar13 == iVar3) {
    iVar13 = iVar13 + 1;
    if (iVar3 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar3 / 2 + iVar3;
    }
    if (iVar13 < iVar11) {
      iVar13 = iVar11;
    }
    if (iVar3 < iVar13) {
      pIVar10 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar13 * 0x38);
      pIVar5 = (this->CmdBuffer).Data;
      if (pIVar5 != (ImDrawCmd *)0x0) {
        memcpy(pIVar10,pIVar5,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar10;
      (this->CmdBuffer).Capacity = iVar13;
    }
  }
  pIVar10 = (this->CmdBuffer).Data;
  iVar13 = (this->CmdBuffer).Size;
  pIVar5 = pIVar10 + iVar13;
  (pIVar5->ClipRect).x = fVar6;
  (pIVar5->ClipRect).y = fVar7;
  (pIVar5->ClipRect).z = fVar8;
  (pIVar5->ClipRect).w = fVar9;
  pIVar10[iVar13].TextureId = pvVar4;
  pIVar10[iVar13].VtxOffset = uVar1;
  pIVar10[iVar13].IdxOffset = uVar2;
  *(undefined8 *)&pIVar10[iVar13].ElemCount = 0;
  *(ImDrawCallback *)(&pIVar10[iVar13].ElemCount + 2) = (ImDrawCallback)0x0;
  pIVar10[iVar13].UserCallbackData = (void *)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  return;
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}